

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleProfileDef::~IfcRectangleProfileDef
          (IfcRectangleProfileDef *this)

{
  ~IfcRectangleProfileDef
            ((IfcRectangleProfileDef *)
             &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.
              _M_string_length);
  return;
}

Assistant:

IfcRectangleProfileDef() : Object("IfcRectangleProfileDef") {}